

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_init(nn_sock *self,nn_socktype *socktype,int fd)

{
  char *pcVar1;
  uint in_EDX;
  nn_efd *in_RSI;
  nn_ctx *in_RDI;
  int i;
  int rc;
  nn_ctx *in_stack_ffffffffffffffc8;
  FILE *__stream;
  nn_ctx *self_00;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  uVar2 = CONCAT13(1,in_stack_ffffffffffffffd8);
  if ((in_RSI[2].efd & 2U) != 0) {
    uVar2 = CONCAT13((in_RSI[2].efd & 1U) != 0,in_stack_ffffffffffffffd8) ^ 0xff000000;
  }
  if ((((byte)(uVar2 >> 0x18) ^ 0xff) & 1) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND) || !(socktype->flags & NN_SOCKTYPE_FLAG_NORECV)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
            ,0x51);
    fflush(_stderr);
    nn_err_abort();
  }
  self_00 = (nn_ctx *)&in_RDI[1].sync.mutex.__data.__list.__next;
  nn_global_getpool();
  nn_ctx_init(self_00,(nn_pool *)in_stack_ffffffffffffffc8,(nn_ctx_onleave)0x134e82);
  nn_fsm_init_root((nn_fsm *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                   (nn_fsm_fn)CONCAT44(in_stack_ffffffffffffffdc,uVar2),(nn_fsm_fn)self_00,
                   in_stack_ffffffffffffffc8);
  in_RDI[1].sync.mutex.__data.__lock = 1;
  if ((in_RSI[2].efd & 2U) == 0) {
    in_stack_ffffffffffffffe0 = nn_efd_init(in_RSI);
    if (in_stack_ffffffffffffffe0 < 0) {
      return in_stack_ffffffffffffffe0;
    }
  }
  else {
    memset((void *)((long)&in_RDI[2].sync.mutex + 0x20),0xcd,4);
  }
  if ((in_RSI[2].efd & 1U) == 0) {
    in_stack_ffffffffffffffe0 = nn_efd_init(in_RSI);
    if (in_stack_ffffffffffffffe0 < 0) {
      if ((in_RSI[2].efd & 2U) != 0) {
        return in_stack_ffffffffffffffe0;
      }
      nn_efd_term((nn_efd *)self_00);
      return in_stack_ffffffffffffffe0;
    }
  }
  else {
    memset((void *)((long)&in_RDI[2].sync.mutex + 0x24),0xcd,4);
  }
  nn_sem_init((nn_sem *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  nn_sem_init((nn_sem *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (in_stack_ffffffffffffffe0 < 0) {
    if ((in_RSI[2].efd & 1U) == 0) {
      nn_efd_term((nn_efd *)self_00);
    }
    local_4 = in_stack_ffffffffffffffe0;
    if ((in_RSI[2].efd & 2U) == 0) {
      nn_efd_term((nn_efd *)self_00);
      local_4 = in_stack_ffffffffffffffe0;
    }
  }
  else {
    *(undefined4 *)((long)&in_RDI[3].events.head + 4) = 1;
    *(undefined4 *)((long)&in_RDI[1].sync.mutex + 0x18) = 0;
    nn_list_init((nn_list *)((long)&in_RDI[3].sync.mutex + 0x10));
    nn_list_init((nn_list *)&in_RDI[3].sync.mutex.__data.__list.__next);
    *(undefined4 *)&in_RDI[3].events.head = 1;
    *(undefined4 *)&in_RDI[3].events.tail = 0x20000;
    *(undefined4 *)((long)&in_RDI[3].events.tail + 4) = 0x20000;
    *(undefined4 *)&in_RDI[3].eventsto.head = 0x100000;
    *(undefined4 *)((long)&in_RDI[3].eventsto.head + 4) = 0xffffffff;
    *(undefined4 *)&in_RDI[3].eventsto.tail = 0xffffffff;
    *(undefined4 *)((long)&in_RDI[3].eventsto.tail + 4) = 100;
    *(undefined4 *)&in_RDI[3].onleave = 0;
    *(undefined4 *)((long)&in_RDI[3].onleave + 4) = 8;
    in_RDI[4].sync.mutex.__data.__lock = 8;
    in_RDI[4].sync.mutex.__data.__count = 8;
    in_RDI[4].sync.mutex.__data.__owner = 1;
    memset(&in_RDI[4].events,0,0x68);
    sprintf((char *)&in_RDI[5].eventsto,"%d",(ulong)in_EDX);
    in_RDI[6].pool = (nn_pool *)0x0;
    in_RDI[6].events.head = (nn_queue_item *)0x0;
    *(undefined4 *)((long)&in_RDI[6].events.tail + 4) = 0x1000;
    *(undefined4 *)&in_RDI[6].events.tail = 0x1000;
    for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
      *(undefined8 *)((long)&in_RDI[4].sync.mutex + (long)iVar3 * 8 + 0x10) = 0;
    }
    iVar3 = (**(code **)(in_RSI + 4))(in_RDI,(undefined1 *)((long)&in_RDI[1].sync.mutex + 8));
    if (iVar3 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar1 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)(uint)-iVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x9e);
      fflush(_stderr);
      nn_err_abort();
    }
    *(nn_efd **)((long)&in_RDI[1].sync.mutex + 0x10) = in_RSI;
    nn_ctx_enter((nn_ctx *)0x135265);
    nn_fsm_start((nn_fsm *)0x13526f);
    nn_ctx_leave(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_sock_init (struct nn_sock *self, const struct nn_socktype *socktype,
    int fd)
{
    int rc;
    int i;

    /* Make sure that at least one message direction is supported. */
    nn_assert (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND) ||
        !(socktype->flags & NN_SOCKTYPE_FLAG_NORECV));

    /*  Create the AIO context for the SP socket. */
    nn_ctx_init (&self->ctx, nn_global_getpool (), nn_sock_onleave);

    /*  Initialise the state machine. */
    nn_fsm_init_root (&self->fsm, nn_sock_handler,
        nn_sock_shutdown, &self->ctx);
    self->state = NN_SOCK_STATE_INIT;

    /*  Open the NN_SNDFD and NN_RCVFD efds. Do so, only if the socket type
        supports send/recv, as appropriate. */
    if (socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
        memset (&self->sndfd, 0xcd, sizeof (self->sndfd));
    else {
        rc = nn_efd_init (&self->sndfd);
        if (nn_slow (rc < 0))
            return rc;
    }
    if (socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
        memset (&self->rcvfd, 0xcd, sizeof (self->rcvfd));
    else {
        rc = nn_efd_init (&self->rcvfd);
        if (nn_slow (rc < 0)) {
            if (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
                nn_efd_term (&self->sndfd);
            return rc;
        }
    }
    nn_sem_init (&self->termsem);
    nn_sem_init (&self->relesem);
    if (nn_slow (rc < 0)) {
        if (!(socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
            nn_efd_term (&self->rcvfd);
        if (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
            nn_efd_term (&self->sndfd);
        return rc;
    }

    self->holds = 1;   /*  Callers hold. */
    self->flags = 0;
    nn_list_init (&self->eps);
    nn_list_init (&self->sdeps);
    self->eid = 1;

    /*  Default values for NN_SOL_SOCKET options. */
    self->sndbuf = 128 * 1024;
    self->rcvbuf = 128 * 1024;
    self->rcvmaxsize = 1024 * 1024;
    self->sndtimeo = -1;
    self->rcvtimeo = -1;
    self->reconnect_ivl = 100;
    self->reconnect_ivl_max = 0;
    self->maxttl = 8;
    self->ep_template.sndprio = 8;
    self->ep_template.rcvprio = 8;
    self->ep_template.ipv4only = 1;

    /* Clear statistic entries */
    memset(&self->statistics, 0, sizeof (self->statistics));

    /*  Should be pretty much enough space for just the number  */
    sprintf(self->socket_name, "%d", fd);

    /* Security attribute */
    self->sec_attr = NULL;
    self->sec_attr_size = 0;
    self->inbuffersz = 4096;
    self->outbuffersz = 4096;

    /*  The transport-specific options are not initialised immediately,
        rather, they are allocated later on when needed. */
    for (i = 0; i != NN_MAX_TRANSPORT; ++i)
        self->optsets [i] = NULL;

    /*  Create the specific socket type itself. */
    rc = socktype->create ((void*) self, &self->sockbase);
    errnum_assert (rc == 0, -rc);
    self->socktype = socktype;

    /*  Launch the state machine. */
    nn_ctx_enter (&self->ctx);
    nn_fsm_start (&self->fsm);
    nn_ctx_leave (&self->ctx);

    return 0;
}